

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicsitem.cpp
# Opt level: O3

void QGraphicsObject::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QPointF *origin;
  ulong *puVar1;
  long lVar2;
  byte bVar3;
  __atomic_base<int> _Var4;
  code *UNRECOVERED_JUMPTABLE;
  int iVar5;
  QGraphicsItem *newParent;
  undefined4 uVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      iVar5 = 0;
      break;
    case 1:
      iVar5 = 1;
      break;
    case 2:
      iVar5 = 2;
      break;
    case 3:
      iVar5 = 3;
      break;
    case 4:
      iVar5 = 4;
      break;
    case 5:
      iVar5 = 5;
      break;
    case 6:
      iVar5 = 6;
      break;
    case 7:
      iVar5 = 7;
      break;
    case 8:
      iVar5 = 8;
      break;
    case 9:
      iVar5 = 9;
      break;
    case 10:
      iVar5 = 10;
      break;
    case 0xb:
      iVar5 = 0xb;
      break;
    default:
      goto switchD_005eb273_caseD_4;
    }
    QMetaObject::activate(_o,&staticMetaObject,iVar5,(void **)0x0);
    return;
  case ReadProperty:
    if (0xd < (uint)_id) {
      return;
    }
    puVar1 = (ulong *)*_a;
    switch(_id) {
    case 0:
      lVar2 = *(long *)(*(long *)(_o + 0x18) + 0x90);
      if (lVar2 == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = lVar2 - 0x10U & (*(long *)(*(long *)(lVar2 + 8) + 0x160) << 7) >> 0x3f;
      }
      goto LAB_005eb6a7;
    case 1:
      uVar7 = *(ulong *)(*(long *)(_o + 0x18) + 0x80);
      break;
    case 2:
      bVar3 = *(byte *)(*(long *)(_o + 0x18) + 0x160) >> 7;
      goto LAB_005eb5ec;
    case 3:
      bVar3 = *(byte *)(*(long *)(_o + 0x18) + 0x160) >> 5 & 1;
LAB_005eb5ec:
      *(byte *)puVar1 = bVar3;
      return;
    case 4:
      lVar2 = *(long *)(_o + 0x18);
      uVar6 = *(undefined4 *)(lVar2 + 0x68);
      uVar8 = *(undefined4 *)(lVar2 + 0x6c);
      uVar9 = *(undefined4 *)(lVar2 + 0x70);
      uVar10 = *(undefined4 *)(lVar2 + 0x74);
      goto LAB_005eb6af;
    case 5:
      uVar7 = *(ulong *)(*(long *)(_o + 0x18) + 0x68);
      break;
    case 6:
      uVar7 = *(ulong *)(*(long *)(_o + 0x18) + 0x70);
      break;
    case 7:
      uVar7 = *(ulong *)(*(long *)(_o + 0x18) + 0x78);
      break;
    case 8:
      if (*(long *)(*(long *)(_o + 0x18) + 0xb0) == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(ulong *)(*(long *)(*(long *)(_o + 0x18) + 0xb0) + 0x58);
      }
      break;
    case 9:
      if (*(long *)(*(long *)(_o + 0x18) + 0xb0) == 0) {
        uVar7 = 0x3ff0000000000000;
      }
      else {
        uVar7 = *(ulong *)(*(long *)(*(long *)(_o + 0x18) + 0xb0) + 0x50);
      }
      break;
    case 10:
      lVar2 = *(long *)(*(long *)(_o + 0x18) + 0xb0);
      if (lVar2 == 0) {
        uVar6 = 0;
        uVar8 = 0;
        uVar9 = 0;
        uVar10 = 0;
      }
      else {
        uVar6 = *(undefined4 *)(lVar2 + 0x60);
        uVar8 = *(undefined4 *)(lVar2 + 100);
        uVar9 = *(undefined4 *)(lVar2 + 0x68);
        uVar10 = *(undefined4 *)(lVar2 + 0x6c);
      }
LAB_005eb6af:
      *(undefined4 *)puVar1 = uVar6;
      *(undefined4 *)((long)puVar1 + 4) = uVar8;
      *(undefined4 *)(puVar1 + 1) = uVar9;
      *(undefined4 *)((long)puVar1 + 0xc) = uVar10;
      return;
    case 0xb:
      uVar7 = *(ulong *)(*(long *)(_o + 0x18) + 0xb8);
LAB_005eb6a7:
      *puVar1 = uVar7;
      return;
    case 0xc:
      uVar7 = (**(code **)(**(long **)(_o + 0x18) + 0x58))();
      break;
    case 0xd:
      uVar7 = (**(code **)(**(long **)(_o + 0x18) + 0x70))();
    }
    *puVar1 = uVar7;
    break;
  case WriteProperty:
    if ((uint)_id < 0xe) {
      origin = (QPointF *)*_a;
      switch(_id) {
      case 0:
        newParent = (QGraphicsItem *)((long)origin->xp + 0x10);
        if (origin->xp == 0.0) {
          newParent = (QGraphicsItem *)0x0;
        }
        QGraphicsItem::setParentItem((QGraphicsItem *)(_o + 0x10),newParent);
        return;
      case 1:
        QGraphicsItem::setOpacity((QGraphicsItem *)(_o + 0x10),origin->xp);
        return;
      case 2:
        QGraphicsItemPrivate::setEnabledHelper
                  (*(QGraphicsItemPrivate **)(_o + 0x18),*(bool *)&origin->xp,true,true);
        return;
      case 3:
        QGraphicsItemPrivate::setVisibleHelper
                  (*(QGraphicsItemPrivate **)(_o + 0x18),*(bool *)&origin->xp,true,true,
                   (bool)((byte)(uint)((ulong)*(undefined8 *)
                                               &(*(QGraphicsItemPrivate **)(_o + 0x18))->field_0x160
                                      >> 0x2e) & 1));
        return;
      case 4:
        QGraphicsItem::setPos((QGraphicsItem *)(_o + 0x10),origin);
        return;
      case 5:
        QGraphicsItem::setX((QGraphicsItem *)(_o + 0x10),origin->xp);
        return;
      case 6:
        QGraphicsItem::setY((QGraphicsItem *)(_o + 0x10),origin->xp);
        return;
      case 7:
        QGraphicsItem::setZValue((QGraphicsItem *)(_o + 0x10),origin->xp);
        return;
      case 8:
        QGraphicsItem::setRotation((QGraphicsItem *)(_o + 0x10),origin->xp);
        return;
      case 9:
        QGraphicsItem::setScale((QGraphicsItem *)(_o + 0x10),origin->xp);
        return;
      case 10:
        QGraphicsItem::setTransformOriginPoint((QGraphicsItem *)(_o + 0x10),origin);
        return;
      case 0xb:
        QGraphicsItem::setGraphicsEffect((QGraphicsItem *)(_o + 0x10),(QGraphicsEffect *)origin->xp)
        ;
        return;
      case 0xc:
        uVar6 = SUB84(origin->xp,0);
        UNRECOVERED_JUMPTABLE = *(code **)(**(long **)(_o + 0x18) + 0x60);
        break;
      case 0xd:
        uVar6 = SUB84(origin->xp,0);
        UNRECOVERED_JUMPTABLE = *(code **)(**(long **)(_o + 0x18) + 0x78);
      }
      (*UNRECOVERED_JUMPTABLE)(uVar6);
      return;
    }
    break;
  case ResetProperty:
    if (_id == 0xd) {
      (**(code **)(**(long **)(_o + 0x18) + 0x80))();
      return;
    }
    if (_id == 0xc) {
      (**(code **)(**(long **)(_o + 0x18) + 0x68))();
      return;
    }
    break;
  case IndexOfMethod:
    UNRECOVERED_JUMPTABLE = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (UNRECOVERED_JUMPTABLE == parentChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (UNRECOVERED_JUMPTABLE == opacityChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (UNRECOVERED_JUMPTABLE == visibleChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (UNRECOVERED_JUMPTABLE == enabledChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (UNRECOVERED_JUMPTABLE == xChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (UNRECOVERED_JUMPTABLE == yChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (UNRECOVERED_JUMPTABLE == zChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 6;
    }
    else if (UNRECOVERED_JUMPTABLE == rotationChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 7;
    }
    else if (UNRECOVERED_JUMPTABLE == scaleChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 8;
    }
    else if (UNRECOVERED_JUMPTABLE == childrenChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 9;
    }
    else if (UNRECOVERED_JUMPTABLE == widthChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 10;
    }
    else if (UNRECOVERED_JUMPTABLE == heightChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0xb;
    }
    break;
  case RegisterPropertyMetaType:
    if (_id == 0) {
      _Var4._M_i = (__int_type)
                   QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsObject_*>::metaType.typeId._q_value
                   .super___atomic_base<int>._M_i;
      if ((__atomic_base<int>)
          QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsObject_*>::metaType.typeId._q_value.
          super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
        _Var4._M_i = QMetaType::registerHelper
                               (&QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsObject_*>::metaType);
      }
      ((__atomic_base<int> *)*_a)->_M_i = _Var4._M_i;
    }
    else {
      *(undefined4 *)*_a = 0xffffffff;
    }
  }
switchD_005eb273_caseD_4:
  return;
}

Assistant:

void QGraphicsObject::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsObject *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->parentChanged(); break;
        case 1: _t->opacityChanged(); break;
        case 2: _t->visibleChanged(); break;
        case 3: _t->enabledChanged(); break;
        case 4: _t->xChanged(); break;
        case 5: _t->yChanged(); break;
        case 6: _t->zChanged(); break;
        case 7: _t->rotationChanged(); break;
        case 8: _t->scaleChanged(); break;
        case 9: _t->childrenChanged(); break;
        case 10: _t->widthChanged(); break;
        case 11: _t->heightChanged(); break;
        case 12: _t->updateMicroFocus(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::parentChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::opacityChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::visibleChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::enabledChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::xChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::yChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::zChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::rotationChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::scaleChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::childrenChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::widthChanged, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::heightChanged, 11))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QGraphicsObject* >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QGraphicsObject**>(_v) = _t->parentObject(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->opacity(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isEnabled(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isVisible(); break;
        case 4: *reinterpret_cast<QPointF*>(_v) = _t->pos(); break;
        case 5: *reinterpret_cast<qreal*>(_v) = _t->x(); break;
        case 6: *reinterpret_cast<qreal*>(_v) = _t->y(); break;
        case 7: *reinterpret_cast<qreal*>(_v) = _t->zValue(); break;
        case 8: *reinterpret_cast<qreal*>(_v) = _t->rotation(); break;
        case 9: *reinterpret_cast<qreal*>(_v) = _t->scale(); break;
        case 10: *reinterpret_cast<QPointF*>(_v) = _t->transformOriginPoint(); break;
        case 11: *reinterpret_cast<QGraphicsEffect**>(_v) = _t->graphicsEffect(); break;
        case 12: *reinterpret_cast<qreal*>(_v) = _t->QGraphicsItem::d_func()->width(); break;
        case 13: *reinterpret_cast<qreal*>(_v) = _t->QGraphicsItem::d_func()->height(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setParentItem(*reinterpret_cast<QGraphicsObject**>(_v)); break;
        case 1: _t->setOpacity(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setVisible(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setPos(*reinterpret_cast<QPointF*>(_v)); break;
        case 5: _t->setX(*reinterpret_cast<qreal*>(_v)); break;
        case 6: _t->setY(*reinterpret_cast<qreal*>(_v)); break;
        case 7: _t->setZValue(*reinterpret_cast<qreal*>(_v)); break;
        case 8: _t->setRotation(*reinterpret_cast<qreal*>(_v)); break;
        case 9: _t->setScale(*reinterpret_cast<qreal*>(_v)); break;
        case 10: _t->setTransformOriginPoint(*reinterpret_cast<QPointF*>(_v)); break;
        case 11: _t->setGraphicsEffect(*reinterpret_cast<QGraphicsEffect**>(_v)); break;
        case 12: _t->QGraphicsItem::d_func()->setWidth(*reinterpret_cast<qreal*>(_v)); break;
        case 13: _t->QGraphicsItem::d_func()->setHeight(*reinterpret_cast<qreal*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 12: _t->QGraphicsItem::d_func()->resetWidth(); break;
        case 13: _t->QGraphicsItem::d_func()->resetHeight(); break;
        default: break;
        }
    }
}